

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::
do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::big_decimal_fp,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,big_decimal_fp *fp,
          basic_format_specs<wchar_t> *specs,float_specs fspecs,locale_ref loc)

{
  char cVar1;
  float_specs fVar2;
  byte bVar3;
  int iVar4;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bVar5;
  byte *pbVar6;
  byte *pbVar7;
  ulong uVar8;
  wchar_t wVar9;
  uint uVar10;
  wchar_t wVar11;
  long lVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  bool pointy;
  int significand_size;
  wchar_t decimal_point;
  sign_t sign;
  wchar_t zero;
  char *significand;
  int exp;
  int num_zeros;
  anon_class_40_8_c3c31ef8 write;
  wchar_t local_d8;
  wchar_t local_d4;
  undefined1 local_d0 [12];
  undefined1 local_c4 [8];
  undefined1 local_bc [16];
  undefined1 local_ac [8];
  int iStack_a4;
  long local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  int local_88;
  anon_class_72_9_d68ba176 local_80;
  basic_format_specs<wchar_t> *local_38;
  
  local_bc._4_8_ = fp->significand;
  local_d4 = fp->significand_size;
  local_bc._0_4_ = 0x30;
  local_d0._4_4_ = fspecs._4_4_;
  local_c4._4_4_ = (uint)local_d0._4_4_ >> 8 & 0xff;
  fVar2 = fspecs;
  if (local_d4 < L'\0') goto LAB_00178fd4;
  uVar15 = (ulong)(uint)((local_d4 + L'\x01') - (uint)(local_c4._4_4_ == 0));
  local_c4._0_4_ = L'.';
  uVar10 = (uint)local_d0._4_4_ >> 0x11;
  local_d0._0_8_ = fspecs;
  if ((uVar10 & 1) != 0) {
    local_c4._0_4_ = fmt::v8::detail::decimal_point_impl<wchar_t>(loc);
  }
  uVar10 = fp->exponent;
  local_ac._0_4_ = local_d4 + uVar10;
  if (SUB81(local_d0._0_8_,4) == '\x01') {
LAB_00178c9c:
    iVar4 = local_d4 + uVar10 + -1;
    if (((uint)local_d0._4_4_ >> 0x14 & 1) == 0) {
      uVar8 = 0;
      if (local_d4 == L'\x01') {
        local_c4._0_4_ = L'\0';
      }
    }
    else {
      uVar8 = 0;
      if (0 < local_d0._0_4_ - local_d4) {
        uVar8 = (ulong)(uint)(local_d0._0_4_ - local_d4);
      }
      uVar15 = uVar15 + uVar8;
    }
    local_80.sign = (sign_t *)CONCAT44(local_80.sign._4_4_,local_c4._4_4_);
    local_80.significand = (char **)local_bc._4_8_;
    local_80.significand_size._0_4_ = local_d4;
    local_80.significand_size._4_4_ = local_c4._0_4_;
    local_80.fp._0_4_ = (int)uVar8;
    local_80.fp = (big_decimal_fp *)CONCAT44(0x30,(int)local_80.fp);
    local_80.grouping =
         (digit_grouping<wchar_t> *)
         (CONCAT44(iVar4,(int)CONCAT71(local_80.grouping._1_7_,
                                       (((uint)local_d0._4_4_ >> 0x10 & 1) == 0) << 5)) | 0x45);
    if (specs->width < 1) {
      if ((ulong)(uint)local_c4._4_4_ != 0) {
        cVar1 = ""[(uint)local_c4._4_4_];
        if ((out.container)->capacity_ < (out.container)->size_ + 1) {
          (**(out.container)->_vptr_buffer)(out.container);
        }
        sVar13 = (out.container)->size_;
        (out.container)->size_ = sVar13 + 1;
        (out.container)->ptr_[sVar13] = (int)cVar1;
      }
      bVar5 = write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t>
                        (out,(char *)local_80.significand,(wchar_t)local_80.significand_size,1,
                         local_80.significand_size._4_4_);
      if (0 < (int)local_80.fp) {
        bVar5 = fill_n<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,int,wchar_t>
                          (bVar5,(int)local_80.fp,(wchar_t *)((long)&local_80.fp + 4));
      }
      wVar9 = (wchar_t)(char)local_80.grouping;
      if ((bVar5.container)->capacity_ < (bVar5.container)->size_ + 1) {
        (**(bVar5.container)->_vptr_buffer)(bVar5.container);
      }
      sVar13 = (bVar5.container)->size_;
      (bVar5.container)->size_ = sVar13 + 1;
      (bVar5.container)->ptr_[sVar13] = wVar9;
      bVar5 = write_exponent<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                        (local_80.grouping._4_4_,bVar5);
    }
    else {
      if ((int)local_ac._0_4_ < 1) {
        iVar4 = 1 - local_ac._0_4_;
      }
      lVar12 = 2;
      if (99 < iVar4) {
        lVar12 = (ulong)(999 < iVar4) + 3;
      }
      sVar13 = uVar15 + (3 - (ulong)(local_c4._0_4_ == L'\0')) + lVar12;
      bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::big_decimal_fp,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_&>
                        (out,specs,sVar13,sVar13,(anon_class_40_8_c3c31ef8 *)&local_80);
    }
  }
  else {
    if ((local_d0._0_8_ & 0xff00000000) == 0) {
      iVar4 = 0x10;
      if (0 < (int)local_d0._0_4_) {
        iVar4 = local_d0._0_4_;
      }
      if (((int)local_ac._0_4_ < -3) || (iVar4 < (int)local_ac._0_4_)) goto LAB_00178c9c;
    }
    if ((int)uVar10 < 0) {
      if ((int)local_ac._0_4_ < 1) {
        iVar4 = -local_ac._0_4_;
        local_ac._4_4_ = iVar4;
        if (SBORROW4(local_d0._0_4_,iVar4) != (int)(local_d0._0_4_ + local_ac._0_4_) < 0) {
          local_ac._4_4_ = local_d0._0_4_;
        }
        if ((int)local_d0._0_4_ < 0) {
          local_ac._4_4_ = iVar4;
        }
        if (local_d4 != L'\0') {
          local_ac._4_4_ = iVar4;
        }
        bVar3 = 1;
        if (local_d4 == L'\0' && local_ac._4_4_ == 0) {
          bVar3 = (local_d0[6] & 0x10) >> 4;
        }
        local_d8 = CONCAT31(local_d8._1_3_,bVar3);
        fVar2 = (float_specs)local_d0._0_8_;
        if (-1 < (int)local_ac._4_4_) {
          sVar13 = ((uint)bVar3 + local_ac._4_4_ + 1) + uVar15;
          local_80.sign = (sign_t *)(local_c4 + 4);
          local_80.significand = (char **)local_bc;
          local_80.fp = (big_decimal_fp *)(local_d0 + 0xc);
          local_80.grouping = (digit_grouping<wchar_t> *)(local_ac + 4);
          local_80.fspecs = (float_specs *)(local_bc + 4);
          local_80.decimal_point = &local_d4;
          local_80.significand_size = &local_d8;
          bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::big_decimal_fp,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_4_&>
                            (out,specs,sVar13,sVar13,(anon_class_56_7_162c6e41 *)&local_80);
          return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar5.container;
        }
LAB_00178fd4:
        local_d0._0_8_ = fVar2;
        fmt::v8::detail::assert_fail
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
                   ,0x195,"negative value");
      }
      uVar14 = 0;
      local_d8 = local_d0._0_4_ - local_d4 & (int)(local_d0._4_4_ << 0xb) >> 0x1f;
      uVar8 = (ulong)(uint)local_d8;
      if (local_d8 < L'\x01') {
        uVar8 = uVar14;
      }
      local_38 = specs;
      digit_grouping<wchar_t>::digit_grouping
                ((digit_grouping<wchar_t> *)(local_ac + 4),loc,
                 (bool)((byte)((uint)local_d0._4_4_ >> 0x11) & 1));
      pbVar6 = (byte *)CONCAT44(iStack_a4,local_ac._4_4_);
      pbVar7 = pbVar6 + local_a0;
      sVar13 = uVar8 + uVar15;
      do {
        wVar9 = L'\x7fffffff';
        if (local_88 != 0) {
          if (pbVar6 == pbVar7) {
            uVar10 = (uint)(char)pbVar7[-1];
          }
          else {
            bVar3 = *pbVar6;
            if ((byte)(bVar3 + 0x81) < 0x82) goto LAB_00178ea8;
            pbVar6 = pbVar6 + 1;
            uVar10 = (uint)bVar3;
          }
          wVar9 = (int)uVar14 + uVar10;
          uVar14 = (ulong)(uint)wVar9;
        }
LAB_00178ea8:
        sVar13 = sVar13 + 1;
      } while (wVar9 < local_d4);
      local_80.sign = (sign_t *)(local_c4 + 4);
      local_80.significand = (char **)(local_bc + 4);
      local_80.significand_size = &local_d4;
      local_80.fp = (big_decimal_fp *)local_ac;
      local_80.grouping = (digit_grouping<wchar_t> *)(local_d0 + 0xc);
      local_80.num_zeros = (int *)local_bc;
      local_80.fspecs = (float_specs *)(local_ac + 4);
      local_80.decimal_point = &local_d8;
      bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::big_decimal_fp,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_3_&>
                        (out,local_38,sVar13,sVar13,(anon_class_64_8_e6ffa566 *)&local_80);
    }
    else {
      lVar12 = uVar10 + uVar15;
      local_d8 = local_d0._0_4_ - local_ac._0_4_;
      if (((uint)local_d0._4_4_ >> 0x14 & 1) != 0) {
        if (SUB81(local_d0._0_8_,4) != '\x02' && local_d8 < L'\x01') {
          local_d8 = L'\x01';
        }
        if (L'\0' < local_d8) {
          lVar12 = lVar12 + (ulong)(uint)local_d8 + 1;
        }
      }
      digit_grouping<wchar_t>::digit_grouping
                ((digit_grouping<wchar_t> *)(local_ac + 4),loc,
                 (bool)((byte)((uint)local_d0._4_4_ >> 0x11) & 1));
      pbVar6 = (byte *)CONCAT44(iStack_a4,local_ac._4_4_);
      pbVar7 = pbVar6 + local_a0;
      sVar13 = lVar12 - 1;
      wVar9 = L'\0';
      do {
        wVar11 = L'\x7fffffff';
        if (local_88 != 0) {
          if (pbVar6 == pbVar7) {
            uVar10 = (uint)(char)pbVar7[-1];
          }
          else {
            bVar3 = *pbVar6;
            if ((byte)(bVar3 + 0x81) < 0x82) goto LAB_00178c35;
            pbVar6 = pbVar6 + 1;
            uVar10 = (uint)bVar3;
          }
          wVar9 = wVar9 + uVar10;
          wVar11 = wVar9;
        }
LAB_00178c35:
        sVar13 = sVar13 + 1;
      } while (wVar11 < local_d4);
      local_80.sign = (sign_t *)(local_c4 + 4);
      local_80.significand = (char **)(local_bc + 4);
      local_80.significand_size = &local_d4;
      local_80.fspecs = (float_specs *)local_d0;
      local_80.decimal_point = (wchar_t *)(local_d0 + 0xc);
      local_80.zero = (wchar_t *)local_bc;
      local_80.fp = fp;
      local_80.grouping = (digit_grouping<wchar_t> *)(local_ac + 4);
      local_80.num_zeros = &local_d8;
      bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::big_decimal_fp,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_2_&>
                        (out,specs,sVar13,sVar13,&local_80);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(iStack_a4,local_ac._4_4_) != &local_98) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(iStack_a4,local_ac._4_4_),local_98._M_allocated_capacity + 1);
    }
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar5.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& fp,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  constexpr Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}